

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetainfoSet.cpp
# Opt level: O3

string * __thiscall
ser::MetainfoSet::ToString_abi_cxx11_(string *__return_storage_ptr__,MetainfoSet *this)

{
  _Rb_tree_node_base *operand;
  pointer pcVar1;
  string *psVar2;
  int iVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  ostream *poVar6;
  bool *pbVar7;
  int *piVar8;
  float *pfVar9;
  double *pdVar10;
  _Base_ptr p_Var11;
  undefined *puVar12;
  char *pcVar13;
  _Rb_tree_header *p_Var14;
  double dVar15;
  ostringstream ss;
  ostringstream ss_1;
  char *local_368;
  long local_360;
  char local_358 [16];
  string *local_348;
  char *local_340;
  long local_338;
  char local_330 [16];
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"[ ",2);
  p_Var11 = (this->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var14 = &(this->data_)._M_t._M_impl.super__Rb_tree_header;
  local_348 = __return_storage_ptr__;
  if ((_Rb_tree_header *)p_Var11 != p_Var14) {
    do {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_320,*(char **)(p_Var11 + 1),(long)p_Var11[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"=",1);
      puVar12 = &void::typeinfo;
      if (*(long **)(p_Var11 + 2) != (long *)0x0) {
        puVar12 = (undefined *)(**(code **)(**(long **)(p_Var11 + 2) + 0x10))();
      }
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      operand = p_Var11 + 2;
      pcVar13 = *(char **)(puVar12 + 8);
      if (pcVar13 == _ofstream) {
LAB_001202d2:
        pbVar7 = boost::any_cast<bool_const&>((any *)operand);
        pcVar13 = "false";
        if ((ulong)*pbVar7 != 0) {
          pcVar13 = "true";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,pcVar13,(ulong)*pbVar7 ^ 5);
      }
      else {
        if (*pcVar13 == '*') {
          if (pcVar13 != _put) {
            if (pcVar13 == ___throw_out_of_range_fmt) {
LAB_00120314:
              pfVar9 = boost::any_cast<float_const&>((any *)operand);
              dVar15 = (double)*pfVar9;
            }
            else {
              if (pcVar13 != __M_extract<float>) {
                if (pcVar13 == "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") {
LAB_001201bd:
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
                  pbVar5 = boost::any_cast<std::__cxx11::string_const&>((any *)operand);
                  local_368 = local_358;
                  pcVar1 = (pbVar5->_M_dataplus)._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_368,pcVar1,pcVar1 + pbVar5->_M_string_length);
                  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_1a8,local_368,local_360);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
                  if (local_368 != local_358) {
                    operator_delete(local_368);
                  }
                }
                goto LAB_00120336;
              }
LAB_00120322:
              pdVar10 = boost::any_cast<double_const&>((any *)operand);
              dVar15 = *pdVar10;
            }
            std::ostream::_M_insert<double>(dVar15);
            goto LAB_00120336;
          }
        }
        else {
          iVar3 = strcmp(pcVar13,_ofstream);
          if (iVar3 == 0) goto LAB_001202d2;
          if ((pcVar13 != _put) && (iVar3 = strcmp(pcVar13,_put), iVar3 != 0)) {
            if ((pcVar13 != ___throw_out_of_range_fmt) &&
               (iVar3 = strcmp(pcVar13,___throw_out_of_range_fmt), iVar3 != 0)) {
              if ((pcVar13 == __M_extract<float>) ||
                 (iVar3 = strcmp(pcVar13,__M_extract<float>), iVar3 == 0)) goto LAB_00120322;
              if ((pcVar13 == "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") ||
                 (iVar3 = strcmp(pcVar13,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE"),
                 iVar3 == 0)) goto LAB_001201bd;
              goto LAB_00120336;
            }
            goto LAB_00120314;
          }
        }
        piVar8 = boost::any_cast<int_const&>((any *)operand);
        std::ostream::operator<<((ostream *)local_1a8,*piVar8);
      }
LAB_00120336:
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_340,local_338);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      if (local_340 != local_330) {
        operator_delete(local_340);
      }
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    } while ((_Rb_tree_header *)p_Var11 != p_Var14);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"]",1);
  psVar2 = local_348;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_320);
  std::ios_base::~ios_base(local_2b0);
  return psVar2;
}

Assistant:

std::string MetainfoSet::ToString() const
{
    std::ostringstream ss;
    ss << "[ ";

    for (std::map<std::string, boost::any>::const_iterator iter = data_.begin(); iter != data_.end(); ++iter)
    {
        ss << iter->first << "=" << writeAny(iter->second) << " ";
    }

    ss << "]";
    return ss.str();
}